

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void __thiscall VmFunction::UpdateDominatorTree(VmFunction *this,VmModule *module,bool clear)

{
  SmallArray<VmBlock_*,_4U> *this_00;
  VmValue *pVVar1;
  uint uVar2;
  VmBlock *curr;
  VmBlock *pVVar3;
  VmValue **ppVVar4;
  VmBlock **ppVVar5;
  VmBlock *pVVar6;
  int iVar7;
  VmBlock *pVVar8;
  uint i;
  uint uVar9;
  uint uVar10;
  VmBlock **ppVVar11;
  uint k;
  bool bVar12;
  VmBlock *pVVar13;
  bool bVar14;
  VmBlock *local_160;
  uint postOrder;
  uint preOrder;
  VmBlock *local_150;
  SmallArray<VmBlock_*,_32U> blocksPostOrder;
  
  pVVar3 = this->firstBlock;
  if (pVVar3 != (VmBlock *)0x0) {
    ppVVar11 = &this->firstBlock;
    for (; pVVar3 != (VmBlock *)0x0; pVVar3 = pVVar3->nextSibling) {
      if (clear) {
        (pVVar3->predecessors).count = 0;
        (pVVar3->successors).count = 0;
      }
      pVVar3->visited = false;
      pVVar3->idom = (VmBlock *)0x0;
      (pVVar3->dominanceFrontier).count = 0;
      (pVVar3->dominanceChildren).count = 0;
    }
    ppVVar5 = ppVVar11;
    while (blocksPostOrder.data = (VmBlock **)*ppVVar5,
          (VmBlock *)blocksPostOrder.data != (VmBlock *)0x0) {
      for (uVar9 = 0; uVar9 < *(uint *)(blocksPostOrder.data + 9); uVar9 = uVar9 + 1) {
        ppVVar4 = SmallArray<VmValue_*,_8U>::operator[]
                            ((SmallArray<VmValue_*,_8U> *)(blocksPostOrder.data + 8),uVar9);
        pVVar1 = *ppVVar4;
        if (((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
           (*(int *)&pVVar1[1]._vptr_VmValue != 0x4d)) {
          SmallArray<VmBlock_*,_4U>::push_back
                    ((SmallArray<VmBlock_*,_4U> *)(blocksPostOrder.data + 0x1d),
                     (VmBlock **)&pVVar1[1].users);
          SmallArray<VmBlock_*,_4U>::push_back
                    ((SmallArray<VmBlock_*,_4U> *)(pVVar1[1].users.data + 0x24),
                     (VmBlock **)&blocksPostOrder);
        }
      }
      ppVVar5 = blocksPostOrder.data + 0x18;
    }
    pVVar3 = *ppVVar11;
    pVVar3->idom = pVVar3;
    blocksPostOrder.allocator = module->allocator;
    blocksPostOrder.data = blocksPostOrder.little;
    blocksPostOrder.count = 0;
    blocksPostOrder.max = 0x20;
    preOrder = 0;
    postOrder = 0;
    anon_unknown.dwarf_20a43d::GetAndNumberControlGraphNodesDfs
              (&blocksPostOrder,pVVar3,&preOrder,&postOrder);
    iVar7 = -1;
    for (uVar9 = 0; uVar9 < blocksPostOrder.count >> 1; uVar9 = uVar9 + 1) {
      ppVVar5 = SmallArray<VmBlock_*,_32U>::operator[](&blocksPostOrder,uVar9);
      pVVar3 = *ppVVar5;
      ppVVar5 = SmallArray<VmBlock_*,_32U>::operator[]
                          (&blocksPostOrder,blocksPostOrder.count + iVar7);
      pVVar13 = *ppVVar5;
      ppVVar5 = SmallArray<VmBlock_*,_32U>::operator[](&blocksPostOrder,uVar9);
      *ppVVar5 = pVVar13;
      ppVVar5 = SmallArray<VmBlock_*,_32U>::operator[]
                          (&blocksPostOrder,blocksPostOrder.count + iVar7);
      *ppVVar5 = pVVar3;
      iVar7 = iVar7 + -1;
    }
    uVar10 = 0;
    uVar9 = blocksPostOrder.count;
    bVar14 = false;
    do {
      for (; bVar12 = bVar14, uVar10 < uVar9; uVar10 = uVar10 + 1) {
        ppVVar5 = SmallArray<VmBlock_*,_32U>::operator[](&blocksPostOrder,uVar10);
        pVVar3 = *ppVVar5;
        if (pVVar3 != *ppVVar11) {
          this_00 = &pVVar3->predecessors;
          pVVar13 = (VmBlock *)0x0;
          uVar9 = 0;
          while ((uVar2 = (pVVar3->predecessors).count, uVar9 < uVar2 && (pVVar13 == (VmBlock *)0x0)
                 )) {
            ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](this_00,uVar9);
            if ((*ppVVar5)->idom == (VmBlock *)0x0) {
              pVVar13 = (VmBlock *)0x0;
            }
            else {
              ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](this_00,uVar9);
              pVVar13 = *ppVVar5;
            }
            uVar9 = uVar9 + 1;
          }
          local_150 = pVVar3;
          if (pVVar13 == (VmBlock *)0x0) {
            __assert_fail("firstProcessed",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x8cc,"void VmFunction::UpdateDominatorTree(VmModule *, bool)");
          }
          pVVar3 = pVVar13;
          for (uVar9 = 0; uVar9 < uVar2; uVar9 = uVar9 + 1) {
            ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](this_00,uVar9);
            pVVar6 = *ppVVar5;
            pVVar8 = pVVar3;
            if ((pVVar6 != pVVar13) && (pVVar6->idom != (VmBlock *)0x0)) {
              while (pVVar8 = pVVar6, pVVar6 != pVVar3) {
                uVar2 = pVVar3->controlGraphPostOrderId;
                for (; pVVar6->controlGraphPostOrderId < uVar2; pVVar6 = pVVar6->idom) {
                }
                while (uVar2 < pVVar6->controlGraphPostOrderId) {
                  pVVar3 = pVVar3->idom;
                  uVar2 = pVVar3->controlGraphPostOrderId;
                }
              }
            }
            uVar2 = (local_150->predecessors).count;
            pVVar3 = pVVar8;
          }
          if (local_150->idom != pVVar3) {
            local_150->idom = pVVar3;
            bVar12 = true;
          }
        }
        uVar9 = blocksPostOrder.count;
        bVar14 = bVar12;
      }
      uVar10 = 0;
      bVar14 = false;
    } while (bVar12);
    local_160 = *ppVVar11;
    local_160->idom = (VmBlock *)0x0;
    for (; ppVVar5 = ppVVar11, local_160 != (VmBlock *)0x0; local_160 = local_160->nextSibling) {
      if (local_160->visited == true) {
        uVar9 = (local_160->predecessors).count;
        if (1 < uVar9) {
          for (uVar10 = 0; uVar10 < uVar9; uVar10 = uVar10 + 1) {
            ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&local_160->predecessors,uVar10);
            pVVar3 = *ppVVar5;
            if (pVVar3->visited == true) {
              for (; pVVar3 != local_160->idom; pVVar3 = pVVar3->idom) {
                uVar9 = 0;
                bVar14 = false;
                while ((uVar9 < (pVVar3->dominanceFrontier).count && (!bVar14))) {
                  ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&pVVar3->dominanceFrontier,uVar9);
                  uVar9 = uVar9 + 1;
                  bVar14 = *ppVVar5 == local_160;
                }
                if (!bVar14) {
                  SmallArray<VmBlock_*,_4U>::push_back(&pVVar3->dominanceFrontier,&local_160);
                }
              }
            }
            uVar9 = (local_160->predecessors).count;
          }
        }
        if (local_160->idom != (VmBlock *)0x0) {
          SmallArray<VmBlock_*,_4U>::push_back(&local_160->idom->dominanceChildren,&local_160);
        }
      }
    }
    while (pVVar3 = *ppVVar5, pVVar3 != (VmBlock *)0x0) {
      pVVar3->visited = false;
      ppVVar5 = &pVVar3->nextSibling;
    }
    preOrder = 0;
    postOrder = 0;
    anon_unknown.dwarf_20a43d::NumberDominanceGraphNodesDfs(*ppVVar11,&preOrder,&postOrder);
    SmallArray<VmBlock_*,_32U>::~SmallArray(&blocksPostOrder);
  }
  return;
}

Assistant:

void VmFunction::UpdateDominatorTree(VmModule *module, bool clear)
{
	if(!firstBlock)
		return;

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		if(clear)
		{
			curr->predecessors.clear();
			curr->successors.clear();
		}

		curr->visited = false;
		curr->idom = NULL;
		curr->dominanceFrontier.clear();
		curr->dominanceChildren.clear();
	}

	// Get block predecessors and successors
	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			VmValue *user = curr->users[i];

			if(VmInstruction *inst = getType<VmInstruction>(user))
			{
				if(inst->cmd != VM_INST_PHI)
				{
					curr->predecessors.push_back(inst->parent);
					inst->parent->successors.push_back(curr);
				}
			}
		}
	}

	firstBlock->idom = firstBlock;

	SmallArray<VmBlock*, 32> blocksPostOrder(module->allocator);
	unsigned preOrder = 0;
	unsigned postOrder = 0;

	GetAndNumberControlGraphNodesDfs(blocksPostOrder, firstBlock, preOrder, postOrder);

	// Get nodes in reverse post order
	for(unsigned i = 0; i < blocksPostOrder.size() / 2; i++)
	{
		VmBlock *tmp = blocksPostOrder[i];
		blocksPostOrder[i] = blocksPostOrder[blocksPostOrder.size() - i - 1];
		blocksPostOrder[blocksPostOrder.size() - i - 1] = tmp;
	}

	bool changed = true;

	while(changed)
	{
		changed = false;

		for(unsigned i = 0; i < blocksPostOrder.size(); i++)
		{
			VmBlock *b = blocksPostOrder[i];

			if(b == firstBlock)
				continue;

			VmBlock *firstProcessed = NULL;

			for(unsigned k = 0; k < b->predecessors.size() && !firstProcessed; k++)
			{
				if(b->predecessors[k]->idom)
					firstProcessed = b->predecessors[k];
			}

			assert(firstProcessed);
			VmBlock *newIdom = firstProcessed;

			for(unsigned k = 0; k < b->predecessors.size(); k++)
			{
				VmBlock *p = b->predecessors[k];

				if(p == firstProcessed)
					continue;

				if(p->idom)
					newIdom = BlockIdomIntersect(p, newIdom);
			}

			if(b->idom != newIdom)
			{
				b->idom = newIdom;
				changed = true;
			}
		}
	}

	firstBlock->idom = NULL;

	// Fill the dominance frontier and dominator tree children
	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		if(!curr->visited)
			continue;

		if(curr->predecessors.size() >= 2)
		{
			for(unsigned i = 0; i < curr->predecessors.size(); i++)
			{
				VmBlock *p = curr->predecessors[i];

				if(!p->visited)
					continue;

				VmBlock *runner = p;

				while(runner != curr->idom)
				{
					bool found = false;
					for(unsigned k = 0; k < runner->dominanceFrontier.size() && !found; k++)
					{
						if(runner->dominanceFrontier[k] == curr)
							found = true;
					}
					if(!found)
						runner->dominanceFrontier.push_back(curr);

					runner = runner->idom;
				}
			}
		}

		if(curr->idom)
			curr->idom->dominanceChildren.push_back(curr);
	}

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
		curr->visited = false;

	preOrder = 0;
	postOrder = 0;
	NumberDominanceGraphNodesDfs(firstBlock, preOrder, postOrder);
}